

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall indk::Position::Position(Position *this,Position *P)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  
  this->Xm = P->Xm;
  uVar5 = (ulong)P->DimensionsCount;
  this->DimensionsCount = P->DimensionsCount;
  pfVar3 = (float *)operator_new__(uVar5 * 4);
  this->X = pfVar3;
  if (uVar5 != 0) {
    uVar1 = P->DimensionsCount;
    pfVar2 = P->X;
    uVar4 = 0;
    do {
      fVar6 = -1.0;
      if (uVar4 < uVar1) {
        fVar6 = pfVar2[uVar4];
      }
      pfVar3[uVar4] = fVar6;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

indk::Position::Position(const indk::Position &P) {
    Xm = P.getXm();
    DimensionsCount = P.getDimensionsCount();
    X = new float[DimensionsCount];
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}